

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::TruncateOutputLog(cmake *this,char *fname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *this_00;
  int iVar2;
  string *psVar3;
  cmValue cVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fullPath;
  stat st;
  string local_100;
  string local_e0;
  undefined1 local_b0 [32];
  size_t local_90;
  char *local_88;
  
  psVar3 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_b0._8_8_ = (psVar3->_M_dataplus)._M_p;
  local_b0._0_8_ = psVar3->_M_string_length;
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = &DAT_00000001;
  local_e0.field_2._M_local_buf[0] = '/';
  local_b0._16_8_ = 1;
  local_e0._M_string_length = (size_type)paVar1;
  local_b0._24_8_ = paVar1;
  local_90 = strlen(fname);
  views._M_len = 3;
  views._M_array = (iterator)local_b0;
  local_88 = fname;
  cmCatViews_abi_cxx11_(&local_100,views);
  iVar2 = stat(local_100._M_dataplus._M_p,(stat *)local_b0);
  if (iVar2 == 0) {
    this_00 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CMAKE_CACHEFILE_DIR","");
    cVar4 = cmState::GetInitializedCacheValue(this_00,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    if (cVar4.Value == (string *)0x0) {
      cmsys::SystemTools::RemoveFile(&local_100);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmake::TruncateOutputLog(const char* fname)
{
  std::string fullPath = cmStrCat(this->GetHomeOutputDirectory(), '/', fname);
  struct stat st;
  if (::stat(fullPath.c_str(), &st)) {
    return;
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) {
    cmSystemTools::RemoveFile(fullPath);
    return;
  }
  off_t fsize = st.st_size;
  const off_t maxFileSize = 50 * 1024;
  if (fsize < maxFileSize) {
    // TODO: truncate file
    return;
  }
}